

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::strconv_cdata(char_t *s,char_t endch)

{
  char_t *pcVar1;
  char in_SIL;
  byte *in_RDI;
  char_t ss;
  gap g;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar2;
  gap *in_stack_ffffffffffffffd8;
  gap *in_stack_ffffffffffffffe0;
  byte *local_10;
  
  gap::gap((gap *)&stack0xffffffffffffffd8);
  local_10 = in_RDI;
  do {
    while (bVar2 = *local_10, ((anonymous_namespace)::chartype_table[bVar2] & 0x10) != 0) {
LAB_001eec7a:
      if (*local_10 == 0xd) {
        *local_10 = 10;
        if (local_10[1] == 10) {
          gap::push(in_stack_ffffffffffffffe0,&in_stack_ffffffffffffffd8->end,
                    CONCAT17(bVar2,in_stack_ffffffffffffffd0));
        }
      }
      else {
        if (((*local_10 == 0x5d) && (local_10[1] == 0x5d)) &&
           ((local_10[2] == 0x3e || ((local_10[2] == 0 && (in_SIL == '>')))))) {
          pcVar1 = gap::flush(in_stack_ffffffffffffffd8,
                              (char_t *)CONCAT17(bVar2,in_stack_ffffffffffffffd0));
          *pcVar1 = '\0';
          return (char_t *)(local_10 + 1);
        }
        if (*local_10 == 0) {
          return (char_t *)0x0;
        }
      }
      local_10 = local_10 + 1;
    }
    bVar2 = local_10[1];
    if (((anonymous_namespace)::chartype_table[bVar2] & 0x10) != 0) {
      local_10 = local_10 + 1;
      goto LAB_001eec7a;
    }
    bVar2 = local_10[2];
    if (((anonymous_namespace)::chartype_table[bVar2] & 0x10) != 0) {
      local_10 = local_10 + 2;
      goto LAB_001eec7a;
    }
    bVar2 = local_10[3];
    if (((anonymous_namespace)::chartype_table[bVar2] & 0x10) != 0) {
      local_10 = local_10 + 3;
      goto LAB_001eec7a;
    }
    local_10 = local_10 + 4;
  } while( true );
}

Assistant:

PUGI_IMPL_FN char_t* strconv_cdata(char_t* s, char_t endch)
	{
		gap g;

		while (true)
		{
			PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_cdata));

			if (*s == '\r') // Either a single 0x0d or 0x0d 0x0a pair
			{
				*s++ = '\n'; // replace first one with 0x0a

				if (*s == '\n') g.push(s, 1);
			}
			else if (s[0] == ']' && s[1] == ']' && PUGI_IMPL_ENDSWITH(s[2], '>')) // CDATA ends here
			{
				*g.flush(s) = 0;

				return s + 1;
			}
			else if (*s == 0)
			{
				return NULL;
			}
			else ++s;
		}
	}